

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O1

void __thiscall libtorrent::cached_piece_entry::cached_piece_entry(cached_piece_entry *this)

{
  (this->read_jobs).m_size = 0;
  (this->read_jobs).m_first = (disk_io_job *)0x0;
  (this->read_jobs).m_last = (disk_io_job *)0x0;
  (this->super_list_node<libtorrent::cached_piece_entry>).prev = (cached_piece_entry *)0x0;
  (this->super_list_node<libtorrent::cached_piece_entry>).next = (cached_piece_entry *)0x0;
  (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
  super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
  super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  (this->storage).super___shared_ptr<libtorrent::storage_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->storage).super___shared_ptr<libtorrent::storage_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->jobs).m_first = (disk_io_job *)0x0;
  (this->jobs).m_last = (disk_io_job *)0x0;
  (this->jobs).m_size = 0;
  (this->hash)._M_t.
  super___uniq_ptr_impl<libtorrent::partial_hash,_std::default_delete<libtorrent::partial_hash>_>.
  _M_t.
  super__Tuple_impl<0UL,_libtorrent::partial_hash_*,_std::default_delete<libtorrent::partial_hash>_>
  .super__Head_base<0UL,_libtorrent::partial_hash_*,_false>._M_head_impl = (partial_hash *)0x0;
  (this->blocks).
  super_unique_ptr<libtorrent::cached_block_entry[],_std::default_delete<libtorrent::cached_block_entry[]>_>
  ._M_t.
  super___uniq_ptr_impl<libtorrent::cached_block_entry,_std::default_delete<libtorrent::cached_block_entry[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::cached_block_entry_*,_std::default_delete<libtorrent::cached_block_entry[]>_>
  .super__Head_base<0UL,_libtorrent::cached_block_entry_*,_false>._M_head_impl =
       (cached_block_entry *)0x0;
  (this->expire).__d.__r = -0x8000000000000000;
  (this->piece).m_val = 0;
  *(ulong *)&this->field_0x7c = *(ulong *)&this->field_0x7c & 0x80000000f0000000;
  *(ushort *)&this->field_0x84 = *(ushort *)&this->field_0x84 & 0x8000;
  this->refcount = 0;
  return;
}

Assistant:

cached_piece_entry::cached_piece_entry()
	: num_dirty(0)
	, num_blocks(0)
	, blocks_in_piece(0)
	, hashing(0)
	, hashing_done(0)
	, marked_for_deletion(false)
	, need_readback(false)
	, cache_state(none)
	, piece_refcount(0)
	, outstanding_flush(0)
	, outstanding_read(0)
	, marked_for_eviction(false)
	, pinned(0)
{}